

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
           *this,object *args,str *args_1,int_ *args_2)

{
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *in_RSI;
  handle in_RDI;
  simple_collector<(pybind11::return_value_policy)1> *in_R8;
  int_ *in_stack_ffffffffffffff98;
  PyObject *in_stack_ffffffffffffffd0;
  
  collect_arguments<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str,pybind11::int_,void>
            ((object *)in_RDI.m_ptr,(str *)in_RDI.m_ptr,in_stack_ffffffffffffff98);
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::derived
            (in_RSI);
  accessor<pybind11::detail::accessor_policies::str_attr>::ptr
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x39f28f);
  simple_collector<(pybind11::return_value_policy)1>::call(in_R8,in_stack_ffffffffffffffd0);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x39f2b6);
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}